

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  int iVar1;
  ImFontAtlasCustomRect *pIVar2;
  ImFontAtlasCustomRect *pIVar3;
  int iVar4;
  int iVar5;
  
  if (0xfffe < width - 1U) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0x8a3,"int ImFontAtlas::AddCustomRectRegular(int, int)");
  }
  if (height - 1U < 0xffff) {
    iVar5 = (this->CustomRects).Size;
    iVar1 = (this->CustomRects).Capacity;
    if (iVar5 == iVar1) {
      iVar5 = iVar5 + 1;
      if (iVar1 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar1 / 2 + iVar1;
      }
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      if (iVar1 < iVar5) {
        pIVar3 = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar5 << 5);
        pIVar2 = (this->CustomRects).Data;
        if (pIVar2 != (ImFontAtlasCustomRect *)0x0) {
          memcpy(pIVar3,pIVar2,(long)(this->CustomRects).Size << 5);
          ImGui::MemFree((this->CustomRects).Data);
        }
        (this->CustomRects).Data = pIVar3;
        (this->CustomRects).Capacity = iVar5;
      }
    }
    pIVar2 = (this->CustomRects).Data;
    iVar5 = (this->CustomRects).Size;
    pIVar2[iVar5].Width = (unsigned_short)width;
    pIVar2[iVar5].Height = (unsigned_short)height;
    pIVar2[iVar5].X = 0xffff;
    pIVar2[iVar5].Y = 0xffff;
    pIVar3 = pIVar2 + iVar5;
    pIVar3->GlyphID = 0;
    pIVar3->GlyphAdvanceX = 0.0;
    ((ImVec2 *)(&pIVar3->GlyphID + 2))->x = 0.0;
    ((ImVec2 *)(&pIVar3->GlyphID + 2))->y = 0.0;
    pIVar2[iVar5].Font = (ImFont *)0x0;
    iVar5 = (this->CustomRects).Size;
    (this->CustomRects).Size = iVar5 + 1;
    return iVar5;
  }
  __assert_fail("height > 0 && height <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                ,0x8a4,"int ImFontAtlas::AddCustomRectRegular(int, int)");
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}